

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterNaive.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::ssc::SscWriterNaive::EndStep(SscWriterNaive *this,bool writerLocked)

{
  Buffer *output;
  size_t sVar1;
  size_t *psVar2;
  void *__ptr;
  size_t i;
  pointer piVar3;
  ulong uVar4;
  int rank;
  allocator_type local_51;
  int globalSize;
  int localSize;
  vector<int,_std::allocator<int>_> localSizes;
  vector<int,_std::allocator<int>_> displs;
  
  output = &(this->super_SscWriterBase).m_Buffer;
  sVar1 = (this->super_SscWriterBase).m_Buffer.m_Size;
  psVar2 = (size_t *)(this->super_SscWriterBase).m_Buffer.m_Buffer;
  *psVar2 = sVar1;
  psVar2[1] = sVar1;
  rank = (this->super_SscWriterBase).m_WriterRank;
  if (rank == 0) {
    SerializeStructDefinitions
              ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
                *)(*(long *)(this->super_SscWriterBase).m_IO + 0x20),output);
    rank = (this->super_SscWriterBase).m_WriterRank;
  }
  if (rank == (this->super_SscWriterBase).m_WriterSize + -1) {
    SerializeAttributes((this->super_SscWriterBase).m_IO,output);
    rank = (this->super_SscWriterBase).m_WriterRank;
  }
  SerializeVariables(&this->m_Metadata,output,rank);
  localSize = *(int *)(this->super_SscWriterBase).m_Buffer.m_Buffer;
  std::vector<int,_std::allocator<int>_>::vector
            (&localSizes,(long)(this->super_SscWriterBase).m_WriterSize,(allocator_type *)&displs);
  MPI_Gather(&localSize,1,&ompi_mpi_int,
             localSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,1,&ompi_mpi_int,0,
             (this->super_SscWriterBase).m_WriterComm);
  globalSize = 0;
  for (piVar3 = localSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar3 != localSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
    globalSize = globalSize + *piVar3;
  }
  __ptr = malloc((long)globalSize);
  std::vector<int,_std::allocator<int>_>::vector
            (&displs,(long)(this->super_SscWriterBase).m_WriterSize,&local_51);
  for (uVar4 = 1; uVar4 < (ulong)(long)(this->super_SscWriterBase).m_WriterSize; uVar4 = uVar4 + 1)
  {
    displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar4] = localSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4 - 1] +
              displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar4 - 1];
  }
  MPI_Gatherv((this->super_SscWriterBase).m_Buffer.m_Buffer,localSize,&ompi_mpi_char,__ptr,
              localSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start,
              displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start,&ompi_mpi_char,0,(this->super_SscWriterBase).m_WriterComm);
  if ((this->super_SscWriterBase).m_WriterRank == 0) {
    MPI_Send(&globalSize,1,&ompi_mpi_int,(this->super_SscWriterBase).m_ReaderMasterStreamRank,0,
             (this->super_SscWriterBase).m_StreamComm);
    MPI_Send(__ptr,globalSize,&ompi_mpi_char,(this->super_SscWriterBase).m_ReaderMasterStreamRank,0,
             (this->super_SscWriterBase).m_StreamComm);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&displs.super__Vector_base<int,_std::allocator<int>_>);
  free(__ptr);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&localSizes.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void SscWriterNaive::EndStep(const bool writerLocked)
{
    m_Buffer.value<uint64_t>() = m_Buffer.size();
    m_Buffer.value<uint64_t>(8) = m_Buffer.size();

    if (m_WriterRank == 0)
    {
        ssc::SerializeStructDefinitions(m_IO.m_ADIOS.m_StructDefinitions, m_Buffer);
    }

    if (m_WriterRank == m_WriterSize - 1)
    {
        ssc::SerializeAttributes(m_IO, m_Buffer);
    }

    ssc::SerializeVariables(m_Metadata, m_Buffer, m_WriterRank);

    int localSize = static_cast<int>(m_Buffer.value<uint64_t>());
    std::vector<int> localSizes(m_WriterSize);
    MPI_Gather(&localSize, 1, MPI_INT, localSizes.data(), 1, MPI_INT, 0, m_WriterComm);
    int globalSize = std::accumulate(localSizes.begin(), localSizes.end(), 0);
    ssc::Buffer globalBuffer(globalSize);

    std::vector<int> displs(m_WriterSize);
    for (size_t i = 1; i < static_cast<size_t>(m_WriterSize); ++i)
    {
        displs[i] = displs[i - 1] + localSizes[i - 1];
    }

    MPI_Gatherv(m_Buffer.data(), localSize, MPI_CHAR, globalBuffer.data(), localSizes.data(),
                displs.data(), MPI_CHAR, 0, m_WriterComm);

    if (m_WriterRank == 0)
    {
        MPI_Send(&globalSize, 1, MPI_INT, m_ReaderMasterStreamRank, 0, m_StreamComm);
        MPI_Send(globalBuffer.data(), globalSize, MPI_CHAR, m_ReaderMasterStreamRank, 0,
                 m_StreamComm);
    }
}